

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::PrintGencodeVersionValidator
          (java *this,Printer *printer,bool oss_runtime,string_view java_class_name)

{
  char *pcVar1;
  Version *pVVar2;
  undefined8 *puVar3;
  AlphaNum *b;
  undefined7 in_register_00000011;
  AlphaNum *c;
  string_view text;
  AlphaNum *local_2e8;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string_view local_240 [3];
  string_view local_210 [3];
  AlphaNum local_1e0;
  AlphaNum local_1b0;
  AlphaNum local_180;
  undefined8 local_150;
  size_t local_148;
  AlphaNum local_120;
  AlphaNum local_f0;
  string_view local_c0 [3];
  AlphaNum local_90;
  string_view local_60 [3];
  
  c = (AlphaNum *)java_class_name._M_str;
  pVVar2 = GetProtobufJavaVersion(SUB81(printer,0));
  pcVar1 = "_runtime_version.Domain.GOOGLE_INTERNAL";
  if ((int)printer != 0) {
    pcVar1 = "_runtime_version.Domain.PUBLIC";
  }
  b = (AlphaNum *)(pcVar1 + 0x18);
  local_2e8 = b;
  local_60[0] = absl::lts_20250127::NullSafeStringView("/* major= */ ");
  absl::lts_20250127::AlphaNum::AlphaNum(&local_90,(pVVar2->field_0)._impl_.major_);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_2c0,(lts_20250127 *)local_60,&local_90,b);
  local_210[0] = absl::lts_20250127::NullSafeStringView("/* minor= */ ");
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1b0,(pVVar2->field_0)._impl_.minor_);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_2e0,(lts_20250127 *)local_210,&local_1b0,b);
  local_240[0] = absl::lts_20250127::NullSafeStringView("/* patch= */ ");
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1e0,(pVVar2->field_0)._impl_.patch_);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_260,(lts_20250127 *)local_240,&local_1e0,b);
  local_c0[0] = absl::lts_20250127::NullSafeStringView("/* suffix= */ \"");
  puVar3 = (undefined8 *)
           ((ulong)(pVVar2->field_0)._impl_.suffix_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  local_f0.piece_._M_str = (char *)*puVar3;
  local_f0.piece_._M_len = puVar3[1];
  local_120.piece_ = absl::lts_20250127::NullSafeStringView("\"");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_280,(lts_20250127 *)local_c0,&local_f0,&local_120,c);
  local_150 = CONCAT71(in_register_00000011,oss_runtime);
  local_148 = java_class_name._M_len;
  local_180.piece_ = absl::lts_20250127::NullSafeStringView(".class.getName()");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_2a0,(lts_20250127 *)&local_150,&local_180,&local_180)
  ;
  text._M_str = 
  "com.google.protobuf.RuntimeVersion.validateProtobufGencodeVersion(\n  com.google.protobuf.RuntimeVersion.RuntimeDomain.$domain$,\n  $major$,\n  $minor$,\n  $patch$,\n  $suffix$,\n  $location$);\n"
  ;
  text._M_len = 0xbc;
  io::Printer::
  Print<char[7],char_const*,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[7],std::__cxx11::string,char[9],std::__cxx11::string>
            ((Printer *)this,text,(char (*) [7])"domain",(char **)&local_2e8,(char (*) [6])"major",
             &local_2c0,(char (*) [6])"minor",&local_2e0,(char (*) [6])"patch",&local_260,
             (char (*) [7])0x4773ba,&local_280,(char (*) [9])0x4dba77,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_2c0);
  return;
}

Assistant:

void PrintGencodeVersionValidator(io::Printer* printer, bool oss_runtime,
                                  absl::string_view java_class_name) {
  const auto& version = GetProtobufJavaVersion(oss_runtime);
  printer->Print(
      "com.google.protobuf.RuntimeVersion.validateProtobufGencodeVersion(\n"
      "  com.google.protobuf.RuntimeVersion.RuntimeDomain.$domain$,\n"
      "  $major$,\n"
      "  $minor$,\n"
      "  $patch$,\n"
      "  $suffix$,\n"
      "  $location$);\n",
      "domain", oss_runtime ? "PUBLIC" : "GOOGLE_INTERNAL", "major",
      absl::StrCat("/* major= */ ", version.major()), "minor",
      absl::StrCat("/* minor= */ ", version.minor()), "patch",
      absl::StrCat("/* patch= */ ", version.patch()), "suffix",
      absl::StrCat("/* suffix= */ \"", version.suffix(), "\""), "location",
      absl::StrCat(java_class_name, ".class.getName()"));
}